

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3TermSelectMerge(Fts3Table *p,TermSelect *pTS,char *aDoclist,int nDoclist)

{
  char *pcVar1;
  int iVar2;
  void *pvVar3;
  int local_4c;
  int rc;
  int nNew;
  char *aNew;
  int iOut;
  int nMerge;
  char *aMerge;
  char *pcStack_28;
  int nDoclist_local;
  char *aDoclist_local;
  TermSelect *pTS_local;
  Fts3Table *p_local;
  
  aMerge._4_4_ = nDoclist;
  pcStack_28 = aDoclist;
  aDoclist_local = (char *)pTS;
  pTS_local = (TermSelect *)p;
  if (pTS->aaOutput[0] == (char *)0x0) {
    pvVar3 = sqlite3_malloc(nDoclist + 0xb);
    *(void **)aDoclist_local = pvVar3;
    *(int *)(aDoclist_local + 0x80) = aMerge._4_4_;
    if (*(long *)aDoclist_local == 0) {
      return 7;
    }
    memcpy(*(void **)aDoclist_local,pcStack_28,(long)aMerge._4_4_);
    memset((void *)(*(long *)aDoclist_local + (long)aMerge._4_4_),0,10);
  }
  else {
    aNew._4_4_ = nDoclist;
    _iOut = aDoclist;
    for (aNew._0_4_ = 0; (int)aNew < 0x10; aNew._0_4_ = (int)aNew + 1) {
      if (*(long *)(aDoclist_local + (long)(int)aNew * 8) == 0) {
        *(char **)(aDoclist_local + (long)(int)aNew * 8) = _iOut;
        *(int *)(aDoclist_local + (long)(int)aNew * 4 + 0x80) = aNew._4_4_;
        return 0;
      }
      iVar2 = fts3DoclistOrMerge((uint)*(byte *)((long)pTS_local[2].aaOutput + 0x47),_iOut,
                                 aNew._4_4_,*(char **)(aDoclist_local + (long)(int)aNew * 8),
                                 *(int *)(aDoclist_local + (long)(int)aNew * 4 + 0x80),(char **)&rc,
                                 &local_4c);
      if (iVar2 != 0) {
        if (_iOut != pcStack_28) {
          sqlite3_free(_iOut);
          return iVar2;
        }
        return iVar2;
      }
      if (_iOut != pcStack_28) {
        sqlite3_free(_iOut);
      }
      sqlite3_free(*(void **)(aDoclist_local + (long)(int)aNew * 8));
      pcVar1 = aDoclist_local + (long)(int)aNew * 8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      _iOut = _rc;
      aNew._4_4_ = local_4c;
      if ((int)aNew == 0xf) {
        *(char **)(aDoclist_local + 0x78) = _rc;
        *(int *)(aDoclist_local + 0xbc) = local_4c;
      }
    }
  }
  return 0;
}

Assistant:

static int fts3TermSelectMerge(
  Fts3Table *p,                   /* FTS table handle */
  TermSelect *pTS,                /* TermSelect object to merge into */
  char *aDoclist,                 /* Pointer to doclist */
  int nDoclist                    /* Size of aDoclist in bytes */
){
  if( pTS->aaOutput[0]==0 ){
    /* If this is the first term selected, copy the doclist to the output
    ** buffer using memcpy(). 
    **
    ** Add FTS3_VARINT_MAX bytes of unused space to the end of the 
    ** allocation. This is so as to ensure that the buffer is big enough
    ** to hold the current doclist AND'd with any other doclist. If the
    ** doclists are stored in order=ASC order, this padding would not be
    ** required (since the size of [doclistA AND doclistB] is always less
    ** than or equal to the size of [doclistA] in that case). But this is
    ** not true for order=DESC. For example, a doclist containing (1, -1) 
    ** may be smaller than (-1), as in the first example the -1 may be stored
    ** as a single-byte delta, whereas in the second it must be stored as a
    ** FTS3_VARINT_MAX byte varint.
    **
    ** Similar padding is added in the fts3DoclistOrMerge() function.
    */
    pTS->aaOutput[0] = sqlite3_malloc(nDoclist + FTS3_VARINT_MAX + 1);
    pTS->anOutput[0] = nDoclist;
    if( pTS->aaOutput[0] ){
      memcpy(pTS->aaOutput[0], aDoclist, nDoclist);
      memset(&pTS->aaOutput[0][nDoclist], 0, FTS3_VARINT_MAX);
    }else{
      return SQLITE_NOMEM;
    }
  }else{
    char *aMerge = aDoclist;
    int nMerge = nDoclist;
    int iOut;

    for(iOut=0; iOut<SizeofArray(pTS->aaOutput); iOut++){
      if( pTS->aaOutput[iOut]==0 ){
        assert( iOut>0 );
        pTS->aaOutput[iOut] = aMerge;
        pTS->anOutput[iOut] = nMerge;
        break;
      }else{
        char *aNew;
        int nNew;

        int rc = fts3DoclistOrMerge(p->bDescIdx, aMerge, nMerge, 
            pTS->aaOutput[iOut], pTS->anOutput[iOut], &aNew, &nNew
        );
        if( rc!=SQLITE_OK ){
          if( aMerge!=aDoclist ) sqlite3_free(aMerge);
          return rc;
        }

        if( aMerge!=aDoclist ) sqlite3_free(aMerge);
        sqlite3_free(pTS->aaOutput[iOut]);
        pTS->aaOutput[iOut] = 0;
  
        aMerge = aNew;
        nMerge = nNew;
        if( (iOut+1)==SizeofArray(pTS->aaOutput) ){
          pTS->aaOutput[iOut] = aMerge;
          pTS->anOutput[iOut] = nMerge;
        }
      }
    }
  }
  return SQLITE_OK;
}